

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm.hpp
# Opt level: O0

result * baryonyx::itm::optimize(result *__return_storage_ptr__,context *ctx,problem *pb)

{
  bool bVar1;
  problem *pb_local;
  context *ctx_local;
  
  if ((ctx->parameters).solver == bastert) {
    bVar1 = std::operator==(&ctx->method,"buffered");
    if (bVar1) {
      optimize_equalities_01(__return_storage_ptr__,ctx,pb);
      return __return_storage_ptr__;
    }
    switch(pb->problem_type) {
    case equalities_01:
      optimize_equalities_01(__return_storage_ptr__,ctx,pb);
      break;
    case equalities_101:
      optimize_equalities_101(__return_storage_ptr__,ctx,pb);
      break;
    case equalities_Z:
      optimize_inequalities_Z(__return_storage_ptr__,ctx,pb);
      break;
    case inequalities_01:
      optimize_inequalities_01(__return_storage_ptr__,ctx,pb);
      break;
    case inequalities_101:
      optimize_inequalities_101(__return_storage_ptr__,ctx,pb);
      break;
    case inequalities_Z:
      optimize_inequalities_Z(__return_storage_ptr__,ctx,pb);
      break;
    default:
switchD_0012f76d_default:
      baryonyx::result::result(__return_storage_ptr__,internal_error);
    }
  }
  else {
    switch(pb->problem_type) {
    case equalities_01:
      optimize_random_equalities_01(__return_storage_ptr__,ctx,pb);
      break;
    case equalities_101:
      optimize_random_equalities_101(__return_storage_ptr__,ctx,pb);
      break;
    case equalities_Z:
      baryonyx::result::result(__return_storage_ptr__,internal_error);
      break;
    case inequalities_01:
      optimize_random_inequalities_01(__return_storage_ptr__,ctx,pb);
      break;
    case inequalities_101:
      optimize_random_inequalities_101(__return_storage_ptr__,ctx,pb);
      break;
    case inequalities_Z:
      baryonyx::result::result(__return_storage_ptr__,internal_error);
      break;
    default:
      goto switchD_0012f76d_default;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline result
optimize(const context& ctx, const problem& pb)
{
    if (ctx.parameters.solver == solver_parameters::solver_type::bastert) {
        if (ctx.method == "buffered")
            return optimize_equalities_01(ctx, pb);

        switch (pb.problem_type) {
        case problem_solver_type::equalities_01:
            return optimize_equalities_01(ctx, pb);

        case problem_solver_type::equalities_101:
            return optimize_equalities_101(ctx, pb);

        case problem_solver_type::equalities_Z:
            return optimize_inequalities_Z(ctx, pb);

        case problem_solver_type::inequalities_01:
            return optimize_inequalities_01(ctx, pb);

        case problem_solver_type::inequalities_101:
            return optimize_inequalities_101(ctx, pb);

        case problem_solver_type::inequalities_Z:
            return optimize_inequalities_Z(ctx, pb);
        }
    } else {
        switch (pb.problem_type) {
        case problem_solver_type::equalities_01:
            return optimize_random_equalities_01(ctx, pb);

        case problem_solver_type::equalities_101:
            return optimize_random_equalities_101(ctx, pb);

        case problem_solver_type::equalities_Z:
            return result(result_status::internal_error);

        case problem_solver_type::inequalities_01:
            return optimize_random_inequalities_01(ctx, pb);

        case problem_solver_type::inequalities_101:
            return optimize_random_inequalities_101(ctx, pb);

        case problem_solver_type::inequalities_Z:
            return result(result_status::internal_error);
        }
    }
    return result(result_status::internal_error);
}